

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

vm_obj_id_t __thiscall CVmObjVector::create_copy(CVmObjVector *this,vm_val_t *self_val)

{
  vm_obj_id_t vVar1;
  CVmObjVector *element_count;
  char *__dest;
  char *__src;
  size_t sVar2;
  vm_val_t *in_RSI;
  CVmObjVector *new_vec;
  vm_obj_id_t new_id;
  undefined8 in_stack_ffffffffffffffb8;
  vm_obj_id_t obj_id;
  CVmObjVector *in_stack_ffffffffffffffc0;
  CVmObjVector *this_00;
  
  obj_id = (vm_obj_id_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  CVmStack::push(in_RSI);
  vVar1 = vm_new_id((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                    obj_id);
  element_count = (CVmObjVector *)CVmObject::operator_new((size_t)in_stack_ffffffffffffffc0,obj_id);
  get_allocated_count((CVmObjVector *)0x3a2390);
  CVmObjVector(in_stack_ffffffffffffffc0,(size_t)element_count);
  this_00 = element_count;
  get_element_count((CVmObjVector *)0x3a23b9);
  set_element_count(this_00,(size_t)element_count);
  __dest = get_element_ptr(this_00,(size_t)element_count);
  __src = get_element_ptr(this_00,(size_t)element_count);
  sVar2 = get_element_count((CVmObjVector *)0x3a23f6);
  sVar2 = calc_alloc_ele(sVar2);
  memcpy(__dest,__src,sVar2);
  CVmStack::discard(1);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjVector::create_copy(VMG_ const vm_val_t *self_val)
{
    vm_obj_id_t new_id;
    CVmObjVector *new_vec;
    
    /* save the original object on the stack for gc protection */
    G_stk->push(self_val);

    /* create a new vector with the same parameters as this one */
    new_id = vm_new_id(vmg_ FALSE, TRUE, FALSE);
    new_vec = new (vmg_ new_id) CVmObjVector(vmg_ get_allocated_count());
    new_vec->set_element_count(get_element_count());

    /* copy the elements from the old vector to the new vector */
    memcpy(new_vec->get_element_ptr(0), get_element_ptr(0),
           calc_alloc_ele(get_element_count()));

    /* done with the gc protection - discard it */
    G_stk->discard(1);

    /* return the new vector's object ID */
    return new_id;
}